

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  void *pvVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  float *pfVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  float *pfVar40;
  uint uVar41;
  uint uVar42;
  float *pfVar43;
  long lVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  long lVar48;
  float *pfVar49;
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined1 auVar52 [16];
  int iVar54;
  undefined1 auVar53 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  int remain;
  
  auVar31 = _DAT_00169d80;
  auVar30 = _DAT_00169d70;
  auVar29 = _DAT_00169bc0;
  iVar10 = top_blob->c;
  if (0 < (long)iVar10) {
    uVar11 = bottom_blob->c;
    iVar12 = top_blob->w;
    uVar13 = top_blob->h;
    pvVar14 = _kernel->data;
    pvVar15 = _bias->data;
    lVar48 = (long)bottom_blob->w;
    pvVar16 = top_blob->data;
    lVar34 = top_blob->cstep * top_blob->elemsize;
    uVar41 = uVar13 * iVar12;
    sVar17 = bottom_blob->cstep;
    sVar18 = bottom_blob->elemsize;
    pvVar19 = bottom_blob->data;
    lVar1 = (ulong)uVar41 - 1;
    auVar50._8_4_ = (int)lVar1;
    auVar50._0_8_ = lVar1;
    auVar50._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar50 = auVar50 ^ _DAT_00169bc0;
    lVar1 = lVar48 + 2;
    lVar39 = (long)pvVar16 + 0xc;
    lVar44 = 0;
    do {
      if (pvVar15 == (void *)0x0) {
        uVar51 = 0;
      }
      else {
        uVar51 = *(undefined4 *)((long)pvVar15 + lVar44 * 4);
      }
      if (0 < (int)uVar41) {
        uVar35 = 0;
        do {
          auVar52._8_4_ = (int)uVar35;
          auVar52._0_8_ = uVar35;
          auVar52._12_4_ = (int)(uVar35 >> 0x20);
          auVar53 = (auVar52 | auVar31) ^ auVar29;
          iVar32 = auVar50._4_4_;
          if ((bool)(~(iVar32 < auVar53._4_4_ ||
                      auVar50._0_4_ < auVar53._0_4_ && auVar53._4_4_ == iVar32) & 1)) {
            *(undefined4 *)(lVar39 + -0xc + uVar35 * 4) = uVar51;
          }
          if (auVar53._12_4_ <= auVar50._12_4_ &&
              (auVar53._8_4_ <= auVar50._8_4_ || auVar53._12_4_ != auVar50._12_4_)) {
            *(undefined4 *)(lVar39 + -8 + uVar35 * 4) = uVar51;
          }
          auVar52 = (auVar52 | auVar30) ^ auVar29;
          iVar54 = auVar52._4_4_;
          if (iVar54 <= iVar32 && (iVar54 != iVar32 || auVar52._0_4_ <= auVar50._0_4_)) {
            *(undefined4 *)(lVar39 + -4 + uVar35 * 4) = uVar51;
            *(undefined4 *)(lVar39 + uVar35 * 4) = uVar51;
          }
          uVar35 = uVar35 + 4;
        } while ((uVar41 + 3 & 0xfffffffc) != uVar35);
      }
      if (0 < (int)uVar11) {
        pfVar36 = (float *)(lVar34 * lVar44 + (long)pvVar16);
        iVar32 = uVar11 * 9 * (int)lVar44;
        uVar35 = 0;
        do {
          pfVar47 = (float *)(sVar17 * sVar18 * uVar35 + (long)pvVar19);
          lVar20 = uVar35 * 0x24;
          pfVar43 = pfVar47 + lVar48;
          pfVar45 = pfVar47 + lVar48 * 2;
          pfVar46 = pfVar36;
          uVar42 = 0;
          if (1 < (int)uVar13) {
            pfVar49 = pfVar47 + lVar48 * 3;
            pfVar40 = pfVar36;
            iVar54 = 0;
            do {
              pfVar40 = pfVar40 + iVar12;
              if (0 < iVar12) {
                lVar37 = 0;
                uVar42 = iVar12 + 1U;
                do {
                  uVar8 = *(undefined8 *)((long)pfVar47 + lVar37 + 4);
                  uVar9 = *(undefined8 *)((long)pfVar43 + lVar37 + 4);
                  pfVar2 = (float *)((long)pvVar14 + lVar20 + (long)iVar32 * 4);
                  fVar21 = *pfVar2;
                  fVar22 = pfVar2[1];
                  fVar23 = pfVar2[2];
                  fVar24 = pfVar2[3];
                  pfVar2 = (float *)((long)pvVar14 + lVar20 + (long)iVar32 * 4 + 0x10);
                  fVar25 = *pfVar2;
                  fVar26 = pfVar2[1];
                  fVar27 = pfVar2[2];
                  fVar28 = pfVar2[3];
                  fVar4 = *(float *)((long)pfVar43 + lVar37);
                  fVar57 = (float)uVar9;
                  fVar58 = (float)((ulong)uVar9 >> 0x20);
                  fVar55 = (float)*(undefined8 *)((long)pfVar45 + lVar37);
                  fVar56 = (float)((ulong)*(undefined8 *)((long)pfVar45 + lVar37) >> 0x20);
                  fVar5 = *(float *)((long)pfVar45 + lVar37 + 8);
                  fVar6 = *(float *)((long)pvVar14 + lVar20 + (long)iVar32 * 4 + 0x20);
                  uVar9 = *(undefined8 *)((long)pfVar49 + lVar37);
                  fVar7 = *(float *)((long)pfVar49 + lVar37 + 8);
                  *(float *)((long)pfVar46 + lVar37) =
                       fVar56 * fVar28 + fVar4 * fVar24 + fVar58 * fVar26 + (float)uVar8 * fVar22 +
                       fVar55 * fVar27 + (float)((ulong)uVar8 >> 0x20) * fVar23 +
                       fVar57 * fVar25 + *(float *)((long)pfVar47 + lVar37) * fVar21 + fVar6 * fVar5
                       + *(float *)((long)pfVar46 + lVar37);
                  *(float *)((long)pfVar40 + lVar37) =
                       (float)((ulong)uVar9 >> 0x20) * fVar28 + fVar55 * fVar24 +
                       fVar5 * fVar26 + fVar21 * fVar4 +
                       (float)uVar9 * fVar27 + fVar58 * fVar23 + fVar56 * fVar25 + fVar22 * fVar57 +
                       fVar6 * fVar7 + *(float *)((long)pfVar40 + lVar37);
                  uVar42 = uVar42 - 1;
                  lVar37 = lVar37 + 4;
                } while (1 < uVar42);
                pfVar46 = (float *)((long)pfVar46 + lVar37);
                pfVar40 = (float *)((long)pfVar40 + lVar37);
                pfVar47 = (float *)((long)pfVar47 + lVar37);
                pfVar49 = (float *)((long)pfVar49 + lVar37);
                pfVar45 = (float *)((long)pfVar45 + lVar37);
                pfVar43 = (float *)((long)pfVar43 + lVar37);
              }
              pfVar47 = pfVar47 + lVar1;
              pfVar43 = pfVar43 + lVar1;
              pfVar45 = pfVar45 + lVar1;
              pfVar49 = pfVar49 + lVar1;
              pfVar46 = pfVar46 + iVar12;
              iVar38 = iVar54 + 3;
              iVar54 = iVar54 + 2;
              uVar42 = uVar13 & 0xfffffffe;
            } while (iVar38 < (int)uVar13);
          }
          if ((int)uVar42 < (int)uVar13) {
            do {
              uVar33 = iVar12 + 1U;
              if (0 < iVar12) {
                do {
                  pfVar40 = pfVar47 + 1;
                  fVar4 = *pfVar47;
                  pfVar47 = pfVar47 + 1;
                  fVar5 = *pfVar43;
                  pfVar49 = pfVar43 + 1;
                  pfVar43 = pfVar43 + 1;
                  uVar8 = *(undefined8 *)pfVar45;
                  pfVar2 = pfVar45 + 2;
                  pfVar45 = pfVar45 + 1;
                  pfVar3 = (float *)((long)pvVar14 + lVar20 + (long)iVar32 * 4);
                  auVar52 = *(undefined1 (*) [16])((long)pvVar14 + lVar20 + (long)iVar32 * 4 + 0x10)
                  ;
                  *pfVar46 = (float)((ulong)uVar8 >> 0x20) * auVar52._12_4_ + fVar5 * pfVar3[3] +
                             (float)((ulong)*(undefined8 *)pfVar49 >> 0x20) * auVar52._4_4_ +
                             (float)*(undefined8 *)pfVar40 * pfVar3[1] +
                             (float)uVar8 * auVar52._8_4_ +
                             (float)((ulong)*(undefined8 *)pfVar40 >> 0x20) * pfVar3[2] +
                             (float)*(undefined8 *)pfVar49 * auVar52._0_4_ + fVar4 * *pfVar3 +
                             *(float *)((long)pvVar14 + lVar20 + (long)iVar32 * 4 + 0x20) * *pfVar2
                             + *pfVar46;
                  pfVar46 = pfVar46 + 1;
                  uVar33 = uVar33 - 1;
                } while (1 < uVar33);
              }
              pfVar47 = pfVar47 + 2;
              pfVar43 = pfVar43 + 2;
              pfVar45 = pfVar45 + 2;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar13);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar11);
      }
      lVar44 = lVar44 + 1;
      lVar39 = lVar39 + lVar34;
    } while (lVar44 != iVar10);
  }
  return;
}

Assistant:

static void conv3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    outptr++;
                    outptr2++;
                }

                r0 += 2 + w;
                r1 += 2 + w;
                r2 += 2 + w;
                r3 += 2 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    outptr++;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

        }
    }

}